

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.h
# Opt level: O0

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::~cmInstallImportedRuntimeArtifactsGenerator
          (cmInstallImportedRuntimeArtifactsGenerator *this)

{
  cmInstallImportedRuntimeArtifactsGenerator *this_local;
  
  ~cmInstallImportedRuntimeArtifactsGenerator(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

~cmInstallImportedRuntimeArtifactsGenerator() override = default;